

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O2

bool __thiscall
ON_Hatch::GetTightBoundingBox
          (ON_Hatch *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  bool bVar1;
  int index;
  int initial_capacity;
  ON_CurveArray curves;
  ON_Curve *local_50;
  ON_SimpleArray<ON_Curve_*> local_48;
  
  initial_capacity = (this->m_loops).m_count;
  ON_CurveArray::ON_CurveArray((ON_CurveArray *)&local_48,initial_capacity);
  index = 0;
  if (initial_capacity < 1) {
    initial_capacity = 0;
  }
  for (; initial_capacity != index; index = index + 1) {
    local_50 = LoopCurve3d(this,index);
    ON_SimpleArray<ON_Curve_*>::Append(&local_48,&local_50);
  }
  bVar1 = ON_CurveArray::GetTightBoundingBox((ON_CurveArray *)&local_48,tight_bbox,bGrowBox,xform);
  ON_CurveArray::~ON_CurveArray((ON_CurveArray *)&local_48);
  return bVar1;
}

Assistant:

bool ON_Hatch::GetTightBoundingBox( ON_BoundingBox& tight_bbox, bool bGrowBox, const ON_Xform* xform) const
{
  int i;
  int count = m_loops.Count();
  ON_CurveArray curves(count);
  for( i = 0; i < count; i++)
  {
    curves.Append( LoopCurve3d(i) );
  }
  return curves.GetTightBoundingBox(tight_bbox,bGrowBox,xform);
}